

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void smooth_pred_8xh(__m128i *pixels,__m128i *wh,__m128i *ww,int h,uint8_t *dst,ptrdiff_t stride,
                    int second_half)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int in_ECX;
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined8 *in_R8;
  long in_R9;
  int iVar6;
  int iVar7;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar16;
  int iVar17;
  __m128i wh_sc;
  __m128i sc_sc;
  __m128i wg_wg;
  int i;
  __m128i d;
  __m128i rep;
  __m128i gat;
  __m128i inc;
  __m128i one;
  __m128i round;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  int local_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3a0;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 local_1b8;
  undefined2 uStack_1b6;
  undefined2 uStack_1b4;
  undefined2 uStack_1b2;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  __m128i sum1;
  __m128i sum0;
  __m128i b;
  __m128i s1;
  __m128i s0;
  
  if ((int)wh_sc[1] == 0) {
    local_4b8 = 0x8000800080008000;
    uStack_4b0 = 0x8000800080008000;
  }
  else {
    local_4b8 = 0x8008800880088008;
    uStack_4b0 = 0x8008800880088008;
  }
  local_3f8 = local_4b8;
  uStack_3f0 = uStack_4b0;
  local_408 = 0x100010001000100;
  uStack_400 = 0x100010001000100;
  local_3a0 = in_R8;
  for (local_40c = 0; local_40c < in_ECX; local_40c = local_40c + 1) {
    auVar11._8_8_ = uStack_400;
    auVar11._0_8_ = local_408;
    auVar8 = pshufb(*in_RSI,auVar11);
    auVar10._8_8_ = uStack_400;
    auVar10._0_8_ = local_408;
    auVar9 = pshufb(in_RSI[1],auVar10);
    local_198 = auVar8._0_2_;
    uStack_196 = auVar8._2_2_;
    uStack_194 = auVar8._4_2_;
    uStack_192 = auVar8._6_2_;
    local_1a8 = auVar9._0_2_;
    uStack_1a6 = auVar9._2_2_;
    uStack_1a4 = auVar9._4_2_;
    uStack_1a2 = auVar9._6_2_;
    auVar5._2_2_ = local_1a8;
    auVar5._0_2_ = local_198;
    auVar5._4_2_ = uStack_196;
    auVar5._6_2_ = uStack_1a6;
    auVar5._10_2_ = uStack_1a4;
    auVar5._8_2_ = uStack_194;
    auVar5._12_2_ = uStack_192;
    auVar5._14_2_ = uStack_1a2;
    auVar8 = pmaddwd(*in_RDI,auVar5);
    auVar4._2_2_ = local_1a8;
    auVar4._0_2_ = local_198;
    auVar4._4_2_ = uStack_196;
    auVar4._6_2_ = uStack_1a6;
    auVar4._10_2_ = uStack_1a4;
    auVar4._8_2_ = uStack_194;
    auVar4._12_2_ = uStack_192;
    auVar4._14_2_ = uStack_1a2;
    auVar10 = pmaddwd(in_RDI[1],auVar4);
    auVar9._8_8_ = uStack_3f0;
    auVar9._0_8_ = local_3f8;
    auVar9 = pshufb(in_RDI[2],auVar9);
    uVar1 = *(undefined8 *)in_RDI[3];
    local_1b8 = auVar9._0_2_;
    uStack_1b6 = auVar9._2_2_;
    uStack_1b4 = auVar9._4_2_;
    uStack_1b2 = auVar9._6_2_;
    local_1c8 = (undefined2)uVar1;
    uStack_1c6 = (undefined2)((ulong)uVar1 >> 0x10);
    uStack_1c4 = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_1c2 = (undefined2)((ulong)uVar1 >> 0x30);
    local_478._0_4_ = CONCAT22(local_1c8,local_1b8);
    local_478._0_6_ = CONCAT24(uStack_1b6,(undefined4)local_478);
    local_478 = CONCAT26(uStack_1c6,(undefined6)local_478);
    uStack_470._0_2_ = uStack_1b4;
    uStack_470._2_2_ = uStack_1c4;
    uStack_470._4_2_ = uStack_1b2;
    uStack_470._6_2_ = uStack_1c2;
    auVar3._8_8_ = uStack_470;
    auVar3._0_8_ = local_478;
    auVar9 = pmaddwd(auVar3,*in_RDX);
    auVar2._8_8_ = uStack_470;
    auVar2._0_8_ = local_478;
    auVar11 = pmaddwd(auVar2,in_RDX[1]);
    local_98 = auVar8._0_4_;
    iStack_94 = auVar8._4_4_;
    iStack_90 = auVar8._8_4_;
    iStack_8c = auVar8._12_4_;
    local_a8 = auVar9._0_4_;
    iStack_a4 = auVar9._4_4_;
    iStack_a0 = auVar9._8_4_;
    iStack_9c = auVar9._12_4_;
    auVar8 = ZEXT416(9);
    iVar6 = local_98 + local_a8 + 0x100 >> auVar8;
    iVar12 = iStack_94 + iStack_a4 + 0x100 >> auVar8;
    iVar14 = iStack_90 + iStack_a0 + 0x100 >> auVar8;
    iVar16 = iStack_8c + iStack_9c + 0x100 >> auVar8;
    local_d8 = auVar10._0_4_;
    iStack_d4 = auVar10._4_4_;
    iStack_d0 = auVar10._8_4_;
    iStack_cc = auVar10._12_4_;
    local_e8 = auVar11._0_4_;
    iStack_e4 = auVar11._4_4_;
    iStack_e0 = auVar11._8_4_;
    iStack_dc = auVar11._12_4_;
    auVar8 = ZEXT416(9);
    iVar7 = local_d8 + local_e8 + 0x100 >> auVar8;
    iVar13 = iStack_d4 + iStack_e4 + 0x100 >> auVar8;
    iVar15 = iStack_d0 + iStack_e0 + 0x100 >> auVar8;
    iVar17 = iStack_cc + iStack_dc + 0x100 >> auVar8;
    local_2d8 = (short)iVar6;
    sStack_2d6 = (short)((uint)iVar6 >> 0x10);
    sStack_2d4 = (short)iVar12;
    sStack_2d2 = (short)((uint)iVar12 >> 0x10);
    sStack_2d0 = (short)iVar14;
    sStack_2ce = (short)((uint)iVar14 >> 0x10);
    sStack_2cc = (short)iVar16;
    sStack_2ca = (short)((uint)iVar16 >> 0x10);
    local_2e8 = (short)iVar7;
    sStack_2e6 = (short)((uint)iVar7 >> 0x10);
    sStack_2e4 = (short)iVar13;
    sStack_2e2 = (short)((uint)iVar13 >> 0x10);
    sStack_2e0 = (short)iVar15;
    sStack_2de = (short)((uint)iVar15 >> 0x10);
    sStack_2dc = (short)iVar17;
    sStack_2da = (short)((uint)iVar17 >> 0x10);
    local_488._0_2_ =
         CONCAT11((0 < sStack_2d6) * (sStack_2d6 < 0x100) * (char)((uint)iVar6 >> 0x10) -
                  (0xff < sStack_2d6),
                  (0 < local_2d8) * (local_2d8 < 0x100) * (char)iVar6 - (0xff < local_2d8));
    local_488._0_3_ =
         CONCAT12((0 < sStack_2d4) * (sStack_2d4 < 0x100) * (char)iVar12 - (0xff < sStack_2d4),
                  (undefined2)local_488);
    local_488._0_4_ =
         CONCAT13((0 < sStack_2d2) * (sStack_2d2 < 0x100) * (char)((uint)iVar12 >> 0x10) -
                  (0xff < sStack_2d2),(undefined3)local_488);
    local_488._0_5_ =
         CONCAT14((0 < sStack_2d0) * (sStack_2d0 < 0x100) * (char)iVar14 - (0xff < sStack_2d0),
                  (undefined4)local_488);
    local_488._0_6_ =
         CONCAT15((0 < sStack_2ce) * (sStack_2ce < 0x100) * (char)((uint)iVar14 >> 0x10) -
                  (0xff < sStack_2ce),(undefined5)local_488);
    local_488._0_7_ =
         CONCAT16((0 < sStack_2cc) * (sStack_2cc < 0x100) * (char)iVar16 - (0xff < sStack_2cc),
                  (undefined6)local_488);
    local_488 = CONCAT17((0 < sStack_2ca) * (sStack_2ca < 0x100) * (char)((uint)iVar16 >> 0x10) -
                         (0xff < sStack_2ca),(undefined7)local_488);
    uStack_480._0_1_ = (0 < local_2e8) * (local_2e8 < 0x100) * (char)iVar7 - (0xff < local_2e8);
    uStack_480._1_1_ =
         (0 < sStack_2e6) * (sStack_2e6 < 0x100) * (char)((uint)iVar7 >> 0x10) - (0xff < sStack_2e6)
    ;
    uStack_480._2_1_ = (0 < sStack_2e4) * (sStack_2e4 < 0x100) * (char)iVar13 - (0xff < sStack_2e4);
    uStack_480._3_1_ =
         (0 < sStack_2e2) * (sStack_2e2 < 0x100) * (char)((uint)iVar13 >> 0x10) -
         (0xff < sStack_2e2);
    uStack_480._4_1_ = (0 < sStack_2e0) * (sStack_2e0 < 0x100) * (char)iVar15 - (0xff < sStack_2e0);
    uStack_480._5_1_ =
         (0 < sStack_2de) * (sStack_2de < 0x100) * (char)((uint)iVar15 >> 0x10) -
         (0xff < sStack_2de);
    uStack_480._6_1_ = (0 < sStack_2dc) * (sStack_2dc < 0x100) * (char)iVar17 - (0xff < sStack_2dc);
    uStack_480._7_1_ =
         (0 < sStack_2da) * (sStack_2da < 0x100) * (char)((uint)iVar17 >> 0x10) -
         (0xff < sStack_2da);
    auVar8._8_8_ = uStack_480;
    auVar8._0_8_ = local_488;
    auVar8 = pshufb(auVar8,ZEXT816(0xe0c0a0806040200));
    local_488 = auVar8._0_8_;
    *local_3a0 = local_488;
    local_3a0 = (undefined8 *)(in_R9 + (long)local_3a0);
    local_298 = (short)local_3f8;
    sStack_296 = (short)((ulong)local_3f8 >> 0x10);
    sStack_294 = (short)((ulong)local_3f8 >> 0x20);
    sStack_292 = (short)((ulong)local_3f8 >> 0x30);
    sStack_290 = (short)uStack_3f0;
    sStack_28e = (short)((ulong)uStack_3f0 >> 0x10);
    sStack_28c = (short)((ulong)uStack_3f0 >> 0x20);
    sStack_28a = (short)((ulong)uStack_3f0 >> 0x30);
    local_3f8 = CONCAT26(sStack_292 + 1,
                         CONCAT24(sStack_294 + 1,CONCAT22(sStack_296 + 1,local_298 + 1)));
    uStack_3f0 = CONCAT26(sStack_28a + 1,
                          CONCAT24(sStack_28c + 1,CONCAT22(sStack_28e + 1,sStack_290 + 1)));
    local_2b8 = (short)local_408;
    sStack_2b6 = (short)((ulong)local_408 >> 0x10);
    sStack_2b4 = (short)((ulong)local_408 >> 0x20);
    sStack_2b2 = (short)((ulong)local_408 >> 0x30);
    sStack_2b0 = (short)uStack_400;
    sStack_2ae = (short)((ulong)uStack_400 >> 0x10);
    sStack_2ac = (short)((ulong)uStack_400 >> 0x20);
    sStack_2aa = (short)((ulong)uStack_400 >> 0x30);
    local_408 = CONCAT26(sStack_2b2 + 0x202,
                         CONCAT24(sStack_2b4 + 0x202,CONCAT22(sStack_2b6 + 0x202,local_2b8 + 0x202))
                        );
    uStack_400 = CONCAT26(sStack_2aa + 0x202,
                          CONCAT24(sStack_2ac + 0x202,
                                   CONCAT22(sStack_2ae + 0x202,sStack_2b0 + 0x202)));
  }
  return;
}

Assistant:

static inline void smooth_pred_8xh(const __m128i *pixels, const __m128i *wh,
                                   const __m128i *ww, int h, uint8_t *dst,
                                   ptrdiff_t stride, int second_half) {
  const __m128i round = _mm_set1_epi32((1 << SMOOTH_WEIGHT_LOG2_SCALE));
  const __m128i one = _mm_set1_epi16(1);
  const __m128i inc = _mm_set1_epi16(0x202);
  const __m128i gat = _mm_set_epi32(0, 0, 0xe0c0a08, 0x6040200);

  __m128i rep = second_half ? _mm_set1_epi16((short)0x8008)
                            : _mm_set1_epi16((short)0x8000);
  __m128i d = _mm_set1_epi16(0x100);

  int i;
  for (i = 0; i < h; ++i) {
    const __m128i wg_wg = _mm_shuffle_epi8(wh[0], d);
    const __m128i sc_sc = _mm_shuffle_epi8(wh[1], d);
    const __m128i wh_sc = _mm_unpacklo_epi16(wg_wg, sc_sc);
    __m128i s0 = _mm_madd_epi16(pixels[0], wh_sc);
    __m128i s1 = _mm_madd_epi16(pixels[1], wh_sc);

    __m128i b = _mm_shuffle_epi8(pixels[2], rep);
    b = _mm_unpacklo_epi16(b, pixels[3]);
    __m128i sum0 = _mm_madd_epi16(b, ww[0]);
    __m128i sum1 = _mm_madd_epi16(b, ww[1]);

    s0 = _mm_add_epi32(s0, sum0);
    s0 = _mm_add_epi32(s0, round);
    s0 = _mm_srai_epi32(s0, 1 + SMOOTH_WEIGHT_LOG2_SCALE);

    s1 = _mm_add_epi32(s1, sum1);
    s1 = _mm_add_epi32(s1, round);
    s1 = _mm_srai_epi32(s1, 1 + SMOOTH_WEIGHT_LOG2_SCALE);

    sum0 = _mm_packus_epi16(s0, s1);
    sum0 = _mm_shuffle_epi8(sum0, gat);
    _mm_storel_epi64((__m128i *)dst, sum0);
    dst += stride;

    rep = _mm_add_epi16(rep, one);
    d = _mm_add_epi16(d, inc);
  }
}